

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O0

void __thiscall re2::Prog::Fanout(Prog *this,SparseArray<int> *fanout)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  InstOp IVar5;
  pointer this_00;
  char *pcVar6;
  iterator piVar7;
  ostream *poVar8;
  int __c;
  __normal_iterator<re2::SparseArray<int>::IndexValue_*,_std::vector<re2::SparseArray<int>::IndexValue,_std::allocator<re2::SparseArray<int>::IndexValue>_>_>
  *__rhs;
  LogMessage local_1f8;
  Inst *local_78;
  Inst *ip;
  iterator piStack_68;
  int id;
  iterator j;
  int *count;
  __normal_iterator<re2::SparseArray<int>::IndexValue_*,_std::vector<re2::SparseArray<int>::IndexValue,_std::allocator<re2::SparseArray<int>::IndexValue>_>_>
  local_50;
  iterator i;
  undefined1 local_30 [8];
  SparseSet reachable;
  SparseArray<int> *fanout_local;
  Prog *this_local;
  
  reachable.dense_ = &fanout->size_;
  iVar3 = SparseArray<int>::max_size(fanout);
  iVar4 = size(this);
  if (iVar3 != iVar4) {
    __assert_fail("(fanout->max_size()) == (size())",
                  "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/nfa.cc",
                  0x2e1,"void re2::Prog::Fanout(SparseArray<int> *)");
  }
  iVar3 = size(this);
  SparseSet::SparseSet((SparseSet *)local_30,iVar3);
  SparseArray<int>::clear((SparseArray<int> *)reachable.dense_);
  piVar1 = reachable.dense_;
  iVar3 = start(this);
  i = SparseArray<int>::set_new((SparseArray<int> *)piVar1,iVar3,0);
  local_50._M_current = (IndexValue *)SparseArray<int>::begin((SparseArray<int> *)reachable.dense_);
  do {
    count = (int *)SparseArray<int>::end((SparseArray<int> *)reachable.dense_);
    __rhs = (__normal_iterator<re2::SparseArray<int>::IndexValue_*,_std::vector<re2::SparseArray<int>::IndexValue,_std::allocator<re2::SparseArray<int>::IndexValue>_>_>
             *)&count;
    bVar2 = __gnu_cxx::operator!=(&local_50,__rhs);
    if (!bVar2) {
      SparseSet::~SparseSet((SparseSet *)local_30);
      return;
    }
    j = &__gnu_cxx::
         __normal_iterator<re2::SparseArray<int>::IndexValue_*,_std::vector<re2::SparseArray<int>::IndexValue,_std::allocator<re2::SparseArray<int>::IndexValue>_>_>
         ::operator->(&local_50)->second;
    SparseSet::clear((SparseSet *)local_30);
    this_00 = __gnu_cxx::
              __normal_iterator<re2::SparseArray<int>::IndexValue_*,_std::vector<re2::SparseArray<int>::IndexValue,_std::allocator<re2::SparseArray<int>::IndexValue>_>_>
              ::operator->(&local_50);
    pcVar6 = SparseArray<int>::IndexValue::index(this_00,(char *)__rhs,__c);
    SparseSet::insert((SparseSet *)local_30,(int)pcVar6);
    for (piStack_68 = SparseSet::begin((SparseSet *)local_30); piVar1 = piStack_68,
        piVar7 = SparseSet::end((SparseSet *)local_30), piVar1 != piVar7;
        piStack_68 = piStack_68 + 1) {
      ip._4_4_ = *piStack_68;
      local_78 = inst(this,ip._4_4_);
      IVar5 = Inst::opcode(local_78);
      switch(IVar5) {
      case kInstAltMatch:
        iVar3 = Inst::last(local_78);
        if (iVar3 != 0) {
          __assert_fail("!ip->last()",
                        "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/nfa.cc"
                        ,0x2fc,"void re2::Prog::Fanout(SparseArray<int> *)");
        }
        SparseSet::insert((SparseSet *)local_30,ip._4_4_ + 1);
        break;
      case kInstByteRange:
        iVar3 = Inst::last(local_78);
        if (iVar3 == 0) {
          SparseSet::insert((SparseSet *)local_30,ip._4_4_ + 1);
        }
        piVar1 = reachable.dense_;
        *j = *j + 1;
        iVar3 = Inst::out(local_78);
        bVar2 = SparseArray<int>::has_index((SparseArray<int> *)piVar1,iVar3);
        piVar1 = reachable.dense_;
        if (!bVar2) {
          iVar3 = Inst::out(local_78);
          SparseArray<int>::set_new((SparseArray<int> *)piVar1,iVar3,0);
        }
        break;
      case kInstCapture:
      case kInstEmptyWidth:
      case kInstNop:
        iVar3 = Inst::last(local_78);
        if (iVar3 == 0) {
          SparseSet::insert((SparseSet *)local_30,ip._4_4_ + 1);
        }
        iVar3 = Inst::out(local_78);
        SparseSet::insert((SparseSet *)local_30,iVar3);
        break;
      case kInstMatch:
        iVar3 = Inst::last(local_78);
        if (iVar3 == 0) {
          SparseSet::insert((SparseSet *)local_30,ip._4_4_ + 1);
        }
        break;
      case kInstFail:
        break;
      default:
        LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_1f8,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/nfa.cc",
                   0x2ee);
        poVar8 = LogMessage::stream(&local_1f8);
        poVar8 = std::operator<<(poVar8,"unhandled ");
        IVar5 = Inst::opcode(local_78);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,IVar5);
        std::operator<<(poVar8," in Prog::Fanout()");
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1f8);
      }
    }
    __gnu_cxx::
    __normal_iterator<re2::SparseArray<int>::IndexValue_*,_std::vector<re2::SparseArray<int>::IndexValue,_std::allocator<re2::SparseArray<int>::IndexValue>_>_>
    ::operator++(&local_50);
  } while( true );
}

Assistant:

void Prog::Fanout(SparseArray<int>* fanout) {
  DCHECK_EQ(fanout->max_size(), size());
  SparseSet reachable(size());
  fanout->clear();
  fanout->set_new(start(), 0);
  for (SparseArray<int>::iterator i = fanout->begin(); i != fanout->end(); ++i) {
    int* count = &i->second;
    reachable.clear();
    reachable.insert(i->index());
    for (SparseSet::iterator j = reachable.begin(); j != reachable.end(); ++j) {
      int id = *j;
      Prog::Inst* ip = inst(id);
      switch (ip->opcode()) {
        default:
          LOG(DFATAL) << "unhandled " << ip->opcode() << " in Prog::Fanout()";
          break;

        case kInstByteRange:
          if (!ip->last())
            reachable.insert(id+1);

          (*count)++;
          if (!fanout->has_index(ip->out())) {
            fanout->set_new(ip->out(), 0);
          }
          break;

        case kInstAltMatch:
          DCHECK(!ip->last());
          reachable.insert(id+1);
          break;

        case kInstCapture:
        case kInstEmptyWidth:
        case kInstNop:
          if (!ip->last())
            reachable.insert(id+1);

          reachable.insert(ip->out());
          break;

        case kInstMatch:
          if (!ip->last())
            reachable.insert(id+1);
          break;

        case kInstFail:
          break;
      }
    }
  }
}